

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

coda_type_text * coda_type_text_new(coda_format format)

{
  coda_type_text *type;
  coda_type_text *pcStack_10;
  coda_format format_local;
  
  pcStack_10 = (coda_type_text *)malloc(0x48);
  if (pcStack_10 == (coda_type_text *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x48,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x7ad);
    pcStack_10 = (coda_type_text *)0x0;
  }
  else {
    pcStack_10->format = format;
    pcStack_10->retain_count = 0;
    pcStack_10->type_class = coda_text_class;
    pcStack_10->read_type = coda_native_type_string;
    pcStack_10->name = (char *)0x0;
    pcStack_10->description = (char *)0x0;
    pcStack_10->bit_size = -1;
    pcStack_10->size_expr = (coda_expression *)0x0;
    pcStack_10->attributes = (coda_type_record *)0x0;
    pcStack_10->fixed_value = (char *)0x0;
    pcStack_10->special_text_type = ascii_text_default;
  }
  return pcStack_10;
}

Assistant:

coda_type_text *coda_type_text_new(coda_format format)
{
    coda_type_text *type;

    type = (coda_type_text *)malloc(sizeof(coda_type_text));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_type_text), __FILE__, __LINE__);
        return NULL;
    }
    type->format = format;
    type->retain_count = 0;
    type->type_class = coda_text_class;
    type->read_type = coda_native_type_string;
    type->name = NULL;
    type->description = NULL;
    type->bit_size = -1;
    type->size_expr = NULL;
    type->attributes = NULL;
    type->fixed_value = NULL;
    type->special_text_type = ascii_text_default;

    return type;
}